

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void add_content_length(http_s *r,uintptr_t length)

{
  FIOBJ key;
  FIOBJ FVar1;
  FIOBJ obj;
  
  if (add_content_length::cl_hash == 0) {
    add_content_length::cl_hash = fiobj_hash_string("content-length",0xe);
  }
  FVar1 = fiobj_hash_get2((r->private_data).out_headers,add_content_length::cl_hash);
  key = HTTP_HEADER_CONTENT_LENGTH;
  if (FVar1 != 0) {
    return;
  }
  FVar1 = (r->private_data).out_headers;
  obj = fiobj_num_new(length);
  fiobj_hash_set(FVar1,key,obj);
  return;
}

Assistant:

static inline void add_content_length(http_s *r, uintptr_t length) {
  static uint64_t cl_hash = 0;
  if (!cl_hash)
    cl_hash = fiobj_hash_string("content-length", 14);
  if (!fiobj_hash_get2(r->private_data.out_headers, cl_hash)) {
    fiobj_hash_set(r->private_data.out_headers, HTTP_HEADER_CONTENT_LENGTH,
                   fiobj_num_new(length));
  }
}